

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O1

void insert_PNode_internal(Parser *p,PNode *pn)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  D_Scope *pDVar6;
  PNode **ppPVar7;
  PNode *pn_00;
  uint uVar8;
  PNode **__s;
  size_t __size;
  ulong uVar9;
  
  pcVar4 = (pn->parse_node).start_loc.s;
  pcVar5 = (pn->parse_node).end_skip;
  iVar2 = (pn->parse_node).symbol;
  pDVar6 = pn->initial_scope;
  uVar3 = (p->pnode_hash).m;
  if (uVar3 < (p->pnode_hash).n + 1) {
    ppPVar7 = (p->pnode_hash).v;
    uVar8 = (p->pnode_hash).i + 1;
    (p->pnode_hash).i = uVar8;
    uVar8 = d_prime2[uVar8];
    (p->pnode_hash).m = uVar8;
    __size = (ulong)uVar8 << 3;
    __s = (PNode **)malloc(__size);
    (p->pnode_hash).v = __s;
    memset(__s,0,__size);
    if ((ulong)uVar3 != 0) {
      uVar9 = 0;
      do {
        while (pn_00 = ppPVar7[uVar9], pn_00 != (PNode *)0x0) {
          ppPVar7[uVar9] = pn_00->bucket_next;
          insert_PNode_internal(p,pn_00);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
    free(ppPVar7);
  }
  ppPVar7 = (p->pnode_hash).v;
  uVar9 = (ulong)(uint)((int)pDVar6 + iVar2 + (int)pcVar5 * 0x10000 + (int)pcVar4 * 0x100) %
          (ulong)(p->pnode_hash).m;
  pn->bucket_next = ppPVar7[uVar9];
  ppPVar7[uVar9] = pn;
  puVar1 = &(p->pnode_hash).n;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void insert_PNode_internal(Parser *p, PNode *pn) {
  PNodeHash *ph = &p->pnode_hash;
  uint h = PNODE_HASH(pn->parse_node.start_loc.s, pn->parse_node.end_skip, pn->parse_node.symbol, pn->initial_scope), i;
  PNode *t;

  if (ph->n + 1 > ph->m) {
    PNode **v = ph->v;
    uint m = ph->m;
    ph->i++;
    ph->m = d_prime2[ph->i];
    ph->v = (PNode **)MALLOC(ph->m * sizeof(*ph->v));
    memset(ph->v, 0, ph->m * sizeof(*ph->v));
    for (i = 0; i < m; i++)
      while ((t = v[i])) {
        v[i] = v[i]->bucket_next;
        insert_PNode_internal(p, t);
      }
    FREE(v);
  }
  pn->bucket_next = ph->v[h % ph->m];
  ph->v[h % ph->m] = pn;
  ph->n++;
}